

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O1

void ggml_rope_cache_init
               (float theta_base,float freq_scale,float *freq_factors,float *corr_dims,int64_t ne0,
               float ext_factor,float mscale,float *cache,float sin_sign,float theta_scale)

{
  float *sin_theta;
  long i0;
  float fVar1;
  
  if (0 < ne0) {
    sin_theta = cache + 1;
    i0 = 0;
    do {
      fVar1 = 1.0;
      if (freq_factors != (float *)0x0) {
        fVar1 = *(float *)((long)freq_factors + i0 * 2);
      }
      rope_yarn(theta_base / fVar1,freq_scale,corr_dims,i0,ext_factor,mscale,sin_theta + -1,
                sin_theta);
      *sin_theta = sin_sign * *sin_theta;
      theta_base = theta_base * theta_scale;
      i0 = i0 + 2;
      sin_theta = sin_theta + 2;
    } while (i0 < ne0);
  }
  return;
}

Assistant:

static void ggml_rope_cache_init(
     float theta_base, float freq_scale, const float * freq_factors, float corr_dims[2], int64_t ne0, float ext_factor, float mscale,
     float * cache, float sin_sign, float theta_scale) {
    // ref: https://github.com/jquesnelle/yarn/blob/master/scaled_rope/LlamaYaRNScaledRotaryEmbedding.py
    float theta = theta_base;
    for (int64_t i0 = 0; i0 < ne0; i0 += 2) {
        const float ff = freq_factors ? freq_factors[i0/2] : 1.0f;
        rope_yarn(
            theta/ff, freq_scale, corr_dims, i0, ext_factor, mscale, &cache[i0 + 0], &cache[i0 + 1]
        );
        cache[i0 + 1] *= sin_sign;

        theta *= theta_scale;
    }
}